

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O1

MemoryLeakDetector * MemoryLeakWarningPlugin::getGlobalDetector(void)

{
  MemoryLeakFailure *reporter;
  MemoryLeakDetector *this;
  
  if (globalDetector == (MemoryLeakDetector *)0x0) {
    saveAndDisableNewDeleteOverloads();
    reporter = (MemoryLeakFailure *)(*operator_new_fptr)(8);
    reporter->_vptr_MemoryLeakFailure = (_func_int **)&PTR__MemoryLeakFailure_0012b058;
    globalReporter = reporter;
    this = (MemoryLeakDetector *)(*operator_new_fptr)(0x1298);
    MemoryLeakDetector::MemoryLeakDetector(this,reporter);
    globalDetector = this;
    restoreNewDeleteOverloads();
  }
  return globalDetector;
}

Assistant:

MemoryLeakDetector* MemoryLeakWarningPlugin::getGlobalDetector()
{
    if (globalDetector == NULLPTR) {
        saveAndDisableNewDeleteOverloads();

        globalReporter = new MemoryLeakWarningReporter;
        globalDetector = new MemoryLeakDetector(globalReporter);

        restoreNewDeleteOverloads();
    }
    return globalDetector;
}